

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::Reader::readComment(Reader *this)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  CommentPlacement placement;
  char *pcVar4;
  Location begin;
  char cVar5;
  bool bVar6;
  
  pcVar3 = this->current_;
  if (pcVar3 == this->end_) {
    cVar5 = '\0';
  }
  else {
    this->current_ = pcVar3 + 1;
    cVar5 = *pcVar3;
  }
  if (cVar5 == '/') {
    pcVar4 = this->current_;
    while (bVar2 = true, pcVar4 != this->end_) {
      this->current_ = pcVar4 + 1;
      cVar1 = *pcVar4;
      if ((cVar1 == '\r') || (pcVar4 = pcVar4 + 1, cVar1 == '\n')) break;
    }
  }
  else if (cVar5 == '*') {
    bVar2 = readCStyleComment(this);
  }
  else {
    bVar2 = false;
  }
  if (bVar2 == false) {
    return bVar2;
  }
  if (this->collectComments_ != true) {
    return bVar2;
  }
  begin = pcVar3 + -1;
  pcVar3 = this->lastValueEnd_;
  placement = commentBefore;
  if (pcVar3 != (char *)0x0) {
    bVar6 = pcVar3 < begin;
    if (bVar6) {
      do {
        if ((*pcVar3 == '\n') || (*pcVar3 == '\r')) break;
        pcVar3 = pcVar3 + 1;
        bVar6 = pcVar3 < begin;
      } while (pcVar3 != begin);
    }
    placement = commentBefore;
    if (!bVar6) {
      if (cVar5 == '*') {
        pcVar3 = this->current_;
        bVar6 = begin < pcVar3;
        pcVar4 = begin;
        if (bVar6) {
          do {
            if ((*pcVar4 == '\n') || (*pcVar4 == '\r')) break;
            pcVar4 = pcVar4 + 1;
            bVar6 = pcVar4 < pcVar3;
          } while (pcVar4 != pcVar3);
        }
        placement = commentBefore;
        if (bVar6) goto LAB_00542ad0;
      }
      placement = commentAfterOnSameLine;
    }
  }
LAB_00542ad0:
  addComment(this,begin,this->current_,placement);
  return bVar2;
}

Assistant:

bool Reader::readComment() {
  Location commentBegin = current_ - 1;
  Char c = getNextChar();
  bool successful = false;
  if (c == '*')
    successful = readCStyleComment();
  else if (c == '/')
    successful = readCppStyleComment();
  if (!successful)
    return false;

  if (collectComments_) {
    CommentPlacement placement = commentBefore;
    if (lastValueEnd_ && !containsNewLine(lastValueEnd_, commentBegin)) {
      if (c != '*' || !containsNewLine(commentBegin, current_))
        placement = commentAfterOnSameLine;
    }

    addComment(commentBegin, current_, placement);
  }
  return true;
}